

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O2

bool __thiscall
LoaderLogger::LogMessage
          (LoaderLogger *this,XrLoaderLogMessageSeverityFlagBits message_severity,
          XrLoaderLogMessageTypeFlags message_type,string *message_id,string *command_name,
          string *message,vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *objects)

{
  pointer puVar1;
  LoaderLogRecorder *pLVar2;
  int iVar3;
  byte bVar4;
  unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *recorder;
  pointer puVar5;
  shared_lock<std::shared_timed_mutex> lock;
  pointer local_c8;
  pointer local_c0;
  pointer local_b8;
  undefined8 local_b0;
  pointer pXStack_a8;
  undefined8 local_a0;
  pointer local_98;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_90;
  NamesAndLabels names_and_labels;
  
  local_a0 = 0;
  local_b0 = 0;
  pXStack_a8 = (pointer)0x0;
  local_c8 = (message_id->_M_dataplus)._M_p;
  local_c0 = (command_name->_M_dataplus)._M_p;
  local_b8 = (message->_M_dataplus)._M_p;
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_90,objects);
  DebugUtilsData::PopulateNamesAndLabels(&names_and_labels,&this->data_,&local_90);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_90);
  pXStack_a8 = names_and_labels.sdk_objects.
               super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
  if (names_and_labels.sdk_objects.
      super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start ==
      names_and_labels.sdk_objects.
      super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pXStack_a8 = (pointer)0x0;
  }
  local_b0 = CONCAT71(local_b0._1_7_,
                      (char)(((long)names_and_labels.objects.
                                    super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)names_and_labels.objects.
                                   super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x28));
  local_98 = (pointer)names_and_labels.labels.
                      super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                      ._M_impl.super__Vector_impl_data._M_start;
  if ((long)names_and_labels.labels.
            super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)names_and_labels.labels.
            super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    local_98 = (pointer)0x0;
  }
  local_a0 = CONCAT71(local_a0._1_7_,
                      (char)(((long)names_and_labels.labels.
                                    super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)names_and_labels.labels.
                                   super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18));
  lock._M_owns = true;
  lock._M_pm = &this->_mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  puVar1 = (this->_recorders).
           super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = 0;
  for (puVar5 = (this->_recorders).
                super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    pLVar2 = (puVar5->_M_t).
             super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
             super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
             super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl;
    if (((message_severity & ~pLVar2->_message_severities) == 0) &&
       ((message_type & ~pLVar2->_message_types) == 0)) {
      iVar3 = (*pLVar2->_vptr_LoaderLogRecorder[6])(pLVar2,message_severity,message_type,&local_c8);
      bVar4 = bVar4 | (byte)iVar3;
    }
  }
  std::shared_lock<std::shared_timed_mutex>::~shared_lock(&lock);
  NamesAndLabels::~NamesAndLabels(&names_and_labels);
  return (bool)(bVar4 & 1);
}

Assistant:

bool LoaderLogger::LogMessage(XrLoaderLogMessageSeverityFlagBits message_severity, XrLoaderLogMessageTypeFlags message_type,
                              const std::string& message_id, const std::string& command_name, const std::string& message,
                              const std::vector<XrSdkLogObjectInfo>& objects) {
    XrLoaderLogMessengerCallbackData callback_data = {};
    callback_data.message_id = message_id.c_str();
    callback_data.command_name = command_name.c_str();
    callback_data.message = message.c_str();

    auto names_and_labels = data_.PopulateNamesAndLabels(objects);
    callback_data.objects = names_and_labels.sdk_objects.empty() ? nullptr : names_and_labels.sdk_objects.data();
    callback_data.object_count = static_cast<uint8_t>(names_and_labels.objects.size());

    callback_data.session_labels = names_and_labels.labels.empty() ? nullptr : names_and_labels.labels.data();
    callback_data.session_labels_count = static_cast<uint8_t>(names_and_labels.labels.size());

    std::shared_lock<std::shared_timed_mutex> lock(_mutex);
    bool exit_app = false;
    for (std::unique_ptr<LoaderLogRecorder>& recorder : _recorders) {
        if ((recorder->MessageSeverities() & message_severity) == message_severity &&
            (recorder->MessageTypes() & message_type) == message_type) {
            exit_app |= recorder->LogMessage(message_severity, message_type, &callback_data);
        }
    }
    return exit_app;
}